

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O2

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
::process_event<afsm::test::alarm>(states_tuple *states,size_t current_state,alarm *event)

{
  event_process_result eVar1;
  invocation_table<afsm::test::alarm> *piVar2;
  logic_error *this;
  indexes_tuple<0UL,_1UL> local_59;
  invocation_table<afsm::test::alarm> inv_table;
  
  if (current_state < 2) {
    piVar2 = inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,afsm::state_machine<afsm::test::human_def,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::human_def::sleeping,afsm::state_machine<afsm::test::human_def,afsm::none,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
             ::state_table<afsm::test::alarm,0ul,1ul>(&local_59);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>,_2UL>
    ::array(&inv_table,piVar2);
    eVar1 = std::
            function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>
            ::operator()(inv_table._M_elems + current_state,states,event);
    std::
    array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::human_def::awake,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::human_def::sleeping,_afsm::state_machine<afsm::test::human_def,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::alarm_&&)>,_2UL>
    ::~array(&inv_table);
    return eVar1;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Invalid current state index");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }